

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O0

boolean dog_hunger(monst *mtmp,edog *edog)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int newmhpmax;
  edog *edog_local;
  monst *mtmp_local;
  
  if (edog->hungrytime + 500 < moves) {
    if (((mtmp->data->mflags1 & 0x20000000) == 0) && ((mtmp->data->mflags1 & 0x40000000) == 0)) {
      edog->hungrytime = moves + 500;
    }
    else if (edog->mhpmax_penalty == 0) {
      iVar2 = mtmp->mhpmax / 3;
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffdfffff | 0x200000;
      edog->mhpmax_penalty = mtmp->mhpmax - iVar2;
      mtmp->mhpmax = iVar2;
      if (mtmp->mhpmax < mtmp->mhp) {
        mtmp->mhp = mtmp->mhpmax;
      }
      if (mtmp->mhp < 1) {
LAB_0019d384:
        if (((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) == 0) || (mtmp == u.usteed)) {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            bVar4 = false;
            if (u.uprops[0x23].intrinsic != 0) {
              bVar4 = true;
              if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
                bVar1 = dmgtype(youmonst.data,0x24);
                bVar4 = bVar1 != '\0';
              }
              bVar4 = (bool)(bVar4 ^ 1);
            }
            pcVar3 = "sad";
            if (bVar4) {
              pcVar3 = "bummed";
            }
            pline("You feel %s for a moment.",pcVar3);
          }
          else {
            pcVar3 = Monnam(mtmp);
            pline("%s starves.",pcVar3);
          }
        }
        else {
          pline("Your leash goes slack.");
        }
        mondied(mtmp);
        return '\x01';
      }
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
          pcVar3 = y_monnam(mtmp);
          pline("You feel worried about %s.",pcVar3);
        }
        else {
          beg(mtmp);
        }
      }
      else {
        pcVar3 = Monnam(mtmp);
        pline("%s is confused from hunger.",pcVar3);
      }
      stop_occupation();
    }
    else if ((edog->hungrytime + 0x2ee < moves) || (mtmp->mhp < 1)) goto LAB_0019d384;
  }
  return '\0';
}

Assistant:

static boolean dog_hunger(struct monst *mtmp, struct edog *edog)
{
	if (moves > edog->hungrytime + 500) {
	    if (!carnivorous(mtmp->data) && !herbivorous(mtmp->data)) {
		edog->hungrytime = moves + 500;
		/* but not too high; it might polymorph */
	    } else if (!edog->mhpmax_penalty) {
		/* starving pets are limited in healing */
		int newmhpmax = mtmp->mhpmax / 3;
		mtmp->mconf = 1;
		edog->mhpmax_penalty = mtmp->mhpmax - newmhpmax;
		mtmp->mhpmax = newmhpmax;
		if (mtmp->mhp > mtmp->mhpmax)
		    mtmp->mhp = mtmp->mhpmax;
		if (mtmp->mhp < 1) goto dog_died;
		if (cansee(mtmp->mx, mtmp->my))
		    pline("%s is confused from hunger.", Monnam(mtmp));
		else if (couldsee(mtmp->mx, mtmp->my))
		    beg(mtmp);
		else
		    pline("You feel worried about %s.", y_monnam(mtmp));
		stop_occupation();
	    } else if (moves > edog->hungrytime + 750 || mtmp->mhp < 1) {
dog_died:
		if (mtmp->mleashed && mtmp != u.usteed)
		    pline("Your leash goes slack.");
		else if (cansee(mtmp->mx, mtmp->my))
		    pline("%s starves.", Monnam(mtmp));
		else
		    pline("You feel %s for a moment.",
			Hallucination ? "bummed" : "sad");
		mondied(mtmp);
		return TRUE;
	    }
	}
	return FALSE;
}